

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O1

int prior(char str)

{
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,str)) {
  case 0x2a:
  case 0x2f:
    return 1;
  case 0x2b:
  case 0x2d:
    return 0;
  case 0x2c:
  case 0x2e:
    goto switchD_00102449_caseD_2c;
  default:
    if (CONCAT31(in_register_00000039,str) == 0x5e) {
      return 2;
    }
switchD_00102449_caseD_2c:
    return -1;
  }
}

Assistant:

int prior(const char str) {
    switch (str){
        case '^':
            return 2;
        case '*':
        case '/':
            return 1;
        case '+':
        case '-':
            return 0;
        default:
            return -1;
    }
}